

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O2

EStatusCode __thiscall Type1Input::ParseCharstrings(Type1Input *this)

{
  InputPFBDecodeStream *this_00;
  BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> BVar1;
  bool bVar2;
  int iVar3;
  EStatusCode EVar4;
  Byte *inBuffer;
  Type1Input *this_01;
  BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_> local_104;
  Type1Input *local_100;
  BoolAndString token;
  undefined1 local_d0 [8];
  string local_c8;
  BoxingBase<int> local_a8;
  string characterName;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  token.first = false;
  token.second._M_dataplus._M_p = (pointer)&token.second.field_2;
  token.second._M_string_length = 0;
  characterName._M_dataplus._M_p = (pointer)&characterName.field_2;
  characterName._M_string_length = 0;
  token.second.field_2._M_local_buf[0] = '\0';
  characterName.field_2._M_local_buf[0] = '\0';
  this_00 = &this->mPFBDecoder;
  local_100 = this;
  do {
    bVar2 = InputPFBDecodeStream::NotEnded(this_00);
    if (!bVar2) break;
    InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_d0,this_00);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&token,(BoolAndString *)local_d0);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    if (token.first != true) break;
    iVar3 = std::__cxx11::string::compare((char *)&token.second);
  } while (iVar3 != 0);
  if (token.first == true) {
    local_100 = (Type1Input *)&local_100->mCharStrings;
    while ((token.first & 1U) != 0) {
      EVar4 = InputPFBDecodeStream::GetInternalState(this_00);
      if (EVar4 != eSuccess) break;
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_d0,this_00);
      std::
      pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&token,(type)local_d0);
      std::__cxx11::string::~string((string *)(local_d0 + 8));
      this_01 = (Type1Input *)&token.second;
      bVar2 = std::operator==("end",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this_01);
      if (bVar2) break;
      FromPSName((string *)local_d0,this_01,&token.second);
      std::__cxx11::string::operator=((string *)&characterName,(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_d0,this_00);
      BoxingBaseWithRW<int,_STDStreamsReader<int>,_STDStreamsWriter<int>_>::BoxingBaseWithRW
                (&local_104,(string *)(local_d0 + 8));
      BVar1.super_BoxingBase<int>.boxedValue = local_104.super_BoxingBase<int>.boxedValue;
      std::__cxx11::string::~string((string *)(local_d0 + 8));
      inBuffer = (Byte *)operator_new__((long)(int)BVar1.super_BoxingBase<int>.boxedValue);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_58,this_00);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      InputPFBDecodeStream::Read(this_00,inBuffer,(long)(int)BVar1.super_BoxingBase<int>.boxedValue)
      ;
      std::__cxx11::string::string((string *)local_d0,(string *)&characterName);
      local_a8 = BVar1.super_BoxingBase<int>.boxedValue;
      local_c8.field_2._8_8_ = inBuffer;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type1CharString>,std::_Select1st<std::pair<std::__cxx11::string_const,Type1CharString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type1CharString>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,Type1CharString>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Type1CharString>,std::_Select1st<std::pair<std::__cxx11::string_const,Type1CharString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Type1CharString>>>
                  *)local_100,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>
                  *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      InputPFBDecodeStream::GetNextToken_abi_cxx11_((BoolAndString *)local_80,this_00);
      std::__cxx11::string::~string((string *)(local_80 + 8));
    }
    EVar4 = InputPFBDecodeStream::GetInternalState(this_00);
  }
  else {
    EVar4 = eFailure;
  }
  std::__cxx11::string::~string((string *)&characterName);
  std::__cxx11::string::~string((string *)&token.second);
  return EVar4;
}

Assistant:

EStatusCode Type1Input::ParseCharstrings()
{
	BoolAndString token;
	std::string characterName;
	Type1CharString charString;

	// skip till "begin"
	while(mPFBDecoder.NotEnded())
	{
		token = mPFBDecoder.GetNextToken();
		if(!token.first || token.second.compare("begin") == 0)
			break;
	}
	if(!token.first)
		return eFailure;

	// Charstrings look like this:
	// charactername nbytes RD ~n~binary~bytes~ ND
	while(token.first && mPFBDecoder.GetInternalState() == eSuccess)
	{
		token = mPFBDecoder.GetNextToken();

		if("end" == token.second)
			break;

		characterName = FromPSName(token.second);

		charString.CodeLength = Int(mPFBDecoder.GetNextToken().second);

		charString.Code = new Byte[charString.CodeLength];

		// skip the RD token (will also skip space)
		mPFBDecoder.GetNextToken();


		mPFBDecoder.Read(charString.Code,charString.CodeLength);

		mCharStrings.insert(StringToType1CharStringMap::value_type(characterName,charString));

		// skip ND token
		mPFBDecoder.GetNextToken();
	}

	return mPFBDecoder.GetInternalState();
}